

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::calcIndicator
          (AbstractScrollAreaPrivate *this,Orientation orient,int minSize,int width,bool *needPaint,
          int *indicatorSize,QPoint *indicatorPos)

{
  double dVar1;
  int iVar2;
  int *piVar3;
  QObject *pQVar4;
  double dVar5;
  int local_c4;
  int local_b0;
  int local_ac;
  int local_94;
  QPoint local_80;
  int local_78;
  int local_74;
  QPoint local_70;
  int local_68;
  int local_64;
  double local_60;
  double deltaRatio;
  double ratio;
  double dStack_48;
  int totalIndicatorSize;
  double posRatio;
  int y;
  int x;
  int scrolledSize;
  int viewportSize;
  int *indicatorSize_local;
  bool *needPaint_local;
  int local_18;
  int width_local;
  int minSize_local;
  Orientation orient_local;
  AbstractScrollAreaPrivate *this_local;
  
  x = 0;
  y = 0;
  posRatio._4_4_ = 0;
  posRatio._0_4_ = 0;
  dStack_48 = 0.0;
  ratio._4_4_ = 0;
  deltaRatio = 0.0;
  local_60 = 0.0;
  _scrolledSize = indicatorSize;
  indicatorSize_local = (int *)needPaint;
  needPaint_local._4_4_ = width;
  local_18 = minSize;
  width_local = orient;
  _minSize_local = this;
  if (orient == Horizontal) {
    x = QWidget::width(this->viewport);
    y = QSize::width(&this->scrolledAreaSize);
    posRatio._4_4_ = needPaint_local._4_4_ << 1;
    local_64 = QWidget::height(this->viewport);
    local_68 = QSize::height(&this->scrolledAreaSize);
    piVar3 = qMin<int>(&local_64,&local_68);
    posRatio._0_4_ = *piVar3 - posRatio._4_4_;
    pQVar4 = QObject::parent((QObject *)this->horIndicator);
    if (pQVar4 == (QObject *)this->viewport) {
      local_94 = 0;
    }
    else {
      local_94 = QPoint::y(&this->topLeftCorner);
    }
    posRatio._0_4_ = local_94 + posRatio._0_4_;
    iVar2 = QPoint::x(&this->topLeftCorner);
    dStack_48 = (double)iVar2 / (double)y;
    piVar3 = qMin<int>(&x,&y);
    ratio._4_4_ = *piVar3 + needPaint_local._4_4_ * -4;
    deltaRatio = (double)x / (double)y;
    local_60 = dStack_48;
    if (1.0 <= deltaRatio) {
      *(undefined1 *)indicatorSize_local = 0;
      *_scrolledSize = ratio._4_4_;
    }
    else {
      *_scrolledSize = (int)((double)ratio._4_4_ * deltaRatio);
      if (*_scrolledSize < local_18) {
        local_60 = ((double)*_scrolledSize / (double)local_18) * dStack_48;
        *_scrolledSize = local_18;
      }
      dVar1 = local_60;
      dVar5 = (double)ratio._4_4_;
      pQVar4 = QObject::parent((QObject *)this->horIndicator);
      if (pQVar4 == (QObject *)this->viewport) {
        local_ac = 0;
      }
      else {
        local_ac = y;
      }
      posRatio._4_4_ = (int)((double)posRatio._4_4_ + dVar5 * dVar1 + (double)local_ac * dStack_48);
    }
    QPoint::QPoint(&local_70,posRatio._4_4_,posRatio._0_4_);
    *indicatorPos = local_70;
  }
  else if (orient == Vertical) {
    x = QWidget::height(this->viewport);
    y = QSize::height(&this->scrolledAreaSize);
    posRatio._0_4_ = needPaint_local._4_4_ << 1;
    local_74 = QWidget::width(this->viewport);
    local_78 = QSize::width(&this->scrolledAreaSize);
    piVar3 = qMin<int>(&local_74,&local_78);
    posRatio._4_4_ = *piVar3 - posRatio._0_4_;
    pQVar4 = QObject::parent((QObject *)this->vertIndicator);
    if (pQVar4 == (QObject *)this->viewport) {
      local_b0 = 0;
    }
    else {
      local_b0 = QPoint::x(&this->topLeftCorner);
    }
    posRatio._4_4_ = local_b0 + posRatio._4_4_;
    iVar2 = QPoint::y(&this->topLeftCorner);
    dStack_48 = (double)iVar2 / (double)y;
    piVar3 = qMin<int>(&x,&y);
    ratio._4_4_ = *piVar3 + needPaint_local._4_4_ * -4;
    deltaRatio = (double)x / (double)y;
    local_60 = dStack_48;
    if (1.0 <= deltaRatio) {
      *(undefined1 *)indicatorSize_local = 0;
      *_scrolledSize = ratio._4_4_;
    }
    else {
      *_scrolledSize = (int)((double)ratio._4_4_ * deltaRatio);
      if (*_scrolledSize < local_18) {
        local_60 = ((double)*_scrolledSize / (double)local_18) * dStack_48;
        *_scrolledSize = local_18;
      }
      dVar1 = local_60;
      dVar5 = (double)ratio._4_4_;
      pQVar4 = QObject::parent((QObject *)this->vertIndicator);
      if (pQVar4 == (QObject *)this->viewport) {
        local_c4 = 0;
      }
      else {
        local_c4 = y;
      }
      posRatio._0_4_ = (int)((double)posRatio._0_4_ + dVar5 * dVar1 + (double)local_c4 * dStack_48);
    }
    QPoint::QPoint(&local_80,posRatio._4_4_,posRatio._0_4_);
    *indicatorPos = local_80;
  }
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::calcIndicator( Qt::Orientation orient,
	int minSize, int width, bool & needPaint,
	int & indicatorSize, QPoint & indicatorPos )
{
	int viewportSize = 0;
	int scrolledSize = 0;
	int x = 0;
	int y = 0;
	double posRatio = 0.0;
	int totalIndicatorSize = 0;
	double ratio = 0.0;
	double deltaRatio = 0.0;

	switch( orient )
	{
		case Qt::Horizontal :
		{
			viewportSize = viewport->width();
			scrolledSize = scrolledAreaSize.width();
			x = 2 * width;
			y = qMin( viewport->height(), scrolledAreaSize.height() ) - x;
			y += ( horIndicator->parent() == viewport ? 0 : topLeftCorner.y() );
			posRatio = (double) topLeftCorner.x() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				x += totalIndicatorSize * deltaRatio
					+ ( horIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;

		case Qt::Vertical :
		{
			viewportSize = viewport->height();
			scrolledSize = scrolledAreaSize.height();
			y = 2 * width;
			x = qMin( viewport->width(), scrolledAreaSize.width() ) - y;
			x += ( vertIndicator->parent() == viewport ? 0 : topLeftCorner.x() );
			posRatio = (double) topLeftCorner.y() / (double) scrolledSize;
			totalIndicatorSize = qMin( viewportSize, scrolledSize ) - 4 * width;
			ratio = (double) viewportSize / (double) scrolledSize;
			deltaRatio = posRatio;

			if( ratio < 1.0 )
			{
				indicatorSize = (double) totalIndicatorSize * ratio;

				if( indicatorSize < minSize )
				{
					deltaRatio *= ( (double) indicatorSize / (double) minSize );
					indicatorSize = minSize;
				}

				y += totalIndicatorSize * deltaRatio
					+ ( vertIndicator->parent() == viewport ? 0 : scrolledSize )
					* posRatio;
			}
			else
			{
				needPaint = false;
				indicatorSize = totalIndicatorSize;
			}

			indicatorPos = QPoint( x, y );
		}
		break;
	}
}